

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipe.c
# Opt level: O0

void uv_pipe_connect(uv_connect_t *req,uv_pipe_t *handle,char *name,uv_connect_cb cb)

{
  int iVar1;
  int *piVar2;
  bool bVar3;
  bool bVar4;
  int local_a0;
  int r;
  int err;
  int new_sock;
  sockaddr_un saddr;
  uv_connect_cb cb_local;
  char *name_local;
  uv_pipe_t *handle_local;
  uv_connect_t *req_local;
  
  bVar3 = (handle->io_watcher).fd == -1;
  saddr.sun_path._100_8_ = cb;
  if (bVar3) {
    local_a0 = uv__socket(1,1,0);
    if (local_a0 < 0) goto LAB_00e0135f;
    (handle->io_watcher).fd = local_a0;
  }
  memset((void *)((long)&err + 2),0,0x6e);
  uv__strscpy((char *)&new_sock,name,0x6c);
  err._2_2_ = 1;
  do {
    iVar1 = connect((handle->io_watcher).fd,(sockaddr *)((long)&err + 2),0x6e);
    bVar4 = false;
    if (iVar1 == -1) {
      piVar2 = __errno_location();
      bVar4 = *piVar2 == 4;
    }
  } while (bVar4);
  if ((iVar1 == -1) && (piVar2 = __errno_location(), *piVar2 != 0x73)) {
    piVar2 = __errno_location();
    local_a0 = -*piVar2;
  }
  else {
    local_a0 = 0;
    if (bVar3) {
      local_a0 = uv__stream_open((uv_stream_t *)handle,(handle->io_watcher).fd,0xc000);
    }
    if (local_a0 == 0) {
      uv__io_start(handle->loop,&handle->io_watcher,4);
    }
  }
LAB_00e0135f:
  handle->delayed_error = local_a0;
  handle->connect_req = req;
  req->type = UV_CONNECT;
  (handle->loop->active_reqs).count = (handle->loop->active_reqs).count + 1;
  req->handle = (uv_stream_t *)handle;
  req->cb = (uv_connect_cb)saddr.sun_path._100_8_;
  req->queue[0] = req->queue;
  req->queue[1] = req->queue;
  if (local_a0 != 0) {
    uv__io_feed(handle->loop,&handle->io_watcher);
  }
  return;
}

Assistant:

void uv_pipe_connect(uv_connect_t* req,
                    uv_pipe_t* handle,
                    const char* name,
                    uv_connect_cb cb) {
  struct sockaddr_un saddr;
  int new_sock;
  int err;
  int r;

  new_sock = (uv__stream_fd(handle) == -1);

  if (new_sock) {
    err = uv__socket(AF_UNIX, SOCK_STREAM, 0);
    if (err < 0)
      goto out;
    handle->io_watcher.fd = err;
  }

  memset(&saddr, 0, sizeof saddr);
  uv__strscpy(saddr.sun_path, name, sizeof(saddr.sun_path));
  saddr.sun_family = AF_UNIX;

  do {
    r = connect(uv__stream_fd(handle),
                (struct sockaddr*)&saddr, sizeof saddr);
  }
  while (r == -1 && errno == EINTR);

  if (r == -1 && errno != EINPROGRESS) {
    err = UV__ERR(errno);
#if defined(__CYGWIN__) || defined(__MSYS__)
    /* EBADF is supposed to mean that the socket fd is bad, but
       Cygwin reports EBADF instead of ENOTSOCK when the file is
       not a socket.  We do not expect to see a bad fd here
       (e.g. due to new_sock), so translate the error.  */
    if (err == UV_EBADF)
      err = UV_ENOTSOCK;
#endif
    goto out;
  }

  err = 0;
  if (new_sock) {
    err = uv__stream_open((uv_stream_t*)handle,
                          uv__stream_fd(handle),
                          UV_HANDLE_READABLE | UV_HANDLE_WRITABLE);
  }

  if (err == 0)
    uv__io_start(handle->loop, &handle->io_watcher, POLLOUT);

out:
  handle->delayed_error = err;
  handle->connect_req = req;

  uv__req_init(handle->loop, req, UV_CONNECT);
  req->handle = (uv_stream_t*)handle;
  req->cb = cb;
  QUEUE_INIT(&req->queue);

  /* Force callback to run on next tick in case of error. */
  if (err)
    uv__io_feed(handle->loop, &handle->io_watcher);

}